

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

PipelineResourceSignatureDescWrapper * __thiscall
Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc
          (PipelineResourceSignatureDescWrapper *__return_storage_ptr__,PipelineStateGLImpl *this,
          TShaderStages *ShaderStages,SHADER_TYPE ActiveStages)

{
  PipelineResourceLayoutDesc *ResourceLayout;
  uint SRBAllocationGranularity;
  RenderDeviceGLImpl *pRVar1;
  GLProgram *this_00;
  pointer pIVar2;
  anon_class_32_4_bf853c0f HandleUB;
  anon_class_32_4_bf853c0f HandleUB_00;
  anon_class_32_4_bf853c0f HandleTexture;
  anon_class_32_4_bf853c0f HandleTexture_00;
  anon_class_32_4_bf853c0f HandleImg;
  anon_class_32_4_bf853c0f HandleImg_00;
  anon_class_32_4_bf853c0f HandleSB;
  anon_class_32_4_bf853c0f HandleSB_00;
  PIPELINE_RESOURCE_FLAGS SamplerResourceFlag;
  LinkStatus LVar3;
  ImmutableSamplerDesc *ImtblSam;
  pointer ppSVar4;
  pointer pIVar5;
  Uint32 NumAllowedTypes;
  char *Args_1;
  GLContextState *State;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_00;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_01;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_02;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_03;
  SHADER_RESOURCE_VARIABLE_TYPE *pSVar6;
  SHADER_RESOURCE_VARIABLE_TYPE *extraout_RDX_04;
  char *pcVar7;
  char *pcVar8;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pImmediateCtx;
  string msg;
  unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
  UniqueResources;
  undefined1 local_190 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  PipelineResourceLayoutDesc *local_168;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_160;
  PipelineResourceSignatureDescWrapper *local_158;
  PipelineStateGLImpl *pPStack_150;
  PipelineResourceLayoutDesc *local_148;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_140;
  PipelineResourceSignatureDescWrapper *local_138;
  PipelineStateGLImpl *pPStack_130;
  PipelineResourceLayoutDesc *local_128;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_120;
  PipelineResourceSignatureDescWrapper *local_118;
  PipelineStateGLImpl *pPStack_110;
  PipelineResourceLayoutDesc *local_108;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_100;
  PipelineResourceSignatureDescWrapper *local_f8;
  PipelineStateGLImpl *pPStack_f0;
  PipelineResourceLayoutDesc *local_e8;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_e0;
  PipelineResourceSignatureDescWrapper *local_d8;
  PipelineStateGLImpl *pPStack_d0;
  PipelineResourceLayoutDesc *local_c8;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_c0;
  PipelineResourceSignatureDescWrapper *local_b8;
  PipelineStateGLImpl *pPStack_b0;
  PipelineResourceLayoutDesc *local_a8;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_a0;
  PipelineResourceSignatureDescWrapper *local_98;
  PipelineStateGLImpl *pPStack_90;
  PipelineResourceLayoutDesc *local_88;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Stack_80;
  PipelineResourceSignatureDescWrapper *local_78;
  PipelineStateGLImpl *pPStack_70;
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  ResourceLayout =
       &(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
        .m_Desc.ResourceLayout;
  SRBAllocationGranularity =
       (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
       super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
       .m_Desc.SRBAllocationGranularity;
  Args_1 = (char *)(ulong)SRBAllocationGranularity;
  PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
            (__return_storage_ptr__,
             (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name,ResourceLayout,SRBAllocationGranularity);
  pcVar7 = "_sampler";
  PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix(__return_storage_ptr__,"_sampler");
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if (this->m_IsProgramPipelineSupported == true) {
    ppSVar4 = (ShaderStages->
              super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ShaderStages->
        super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppSVar4) {
      pcVar8 = (char *)0x0;
      pSVar6 = extraout_RDX;
      do {
        HandleUB.UniqueResources =
             (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
              *)&local_68;
        HandleUB.ResourceLayout = ResourceLayout;
        HandleUB.SignDesc = __return_storage_ptr__;
        HandleUB.this = this;
        HandleTexture.UniqueResources =
             (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
              *)&local_68;
        HandleTexture.ResourceLayout = ResourceLayout;
        HandleTexture.SignDesc = __return_storage_ptr__;
        HandleTexture.this = this;
        HandleImg.UniqueResources =
             (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
              *)&local_68;
        HandleImg.ResourceLayout = ResourceLayout;
        HandleImg.SignDesc = __return_storage_ptr__;
        HandleImg.this = this;
        HandleSB.UniqueResources =
             (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
              *)&local_68;
        HandleSB.ResourceLayout = ResourceLayout;
        HandleSB.SignDesc = __return_storage_ptr__;
        HandleSB.this = this;
        local_e8 = ResourceLayout;
        p_Stack_e0 = &local_68;
        local_d8 = __return_storage_ptr__;
        pPStack_d0 = this;
        local_c8 = ResourceLayout;
        p_Stack_c0 = &local_68;
        local_b8 = __return_storage_ptr__;
        pPStack_b0 = this;
        local_a8 = ResourceLayout;
        p_Stack_a0 = &local_68;
        local_98 = __return_storage_ptr__;
        pPStack_90 = this;
        local_88 = ResourceLayout;
        p_Stack_80 = &local_68;
        local_78 = __return_storage_ptr__;
        pPStack_70 = this;
        ShaderResourcesGL::
        ProcessConstResources<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0>
                  ((ppSVar4[(long)pcVar8]->m_pShaderResources).
                   super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,HandleUB,HandleTexture,HandleImg,HandleSB,
                   (PipelineResourceLayoutDesc *)pcVar7,pSVar6,(Uint32)Args_1);
        pcVar8 = pcVar8 + 1;
        ppSVar4 = (ShaderStages->
                  super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        Args_1 = (char *)((long)(ShaderStages->
                                super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3);
        pSVar6 = extraout_RDX_00;
      } while (pcVar8 < Args_1);
    }
    goto LAB_0017b93b;
  }
  pRVar1 = (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
           .m_pDevice;
  if ((pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pRVar1->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_190._0_8_ = (DeviceContextGLImpl *)0x0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)local_190);
  }
  if ((DeviceContextGLImpl *)local_190._0_8_ == (DeviceContextGLImpl *)0x0) {
    FormatString<char[26],char[14]>
              ((string *)(local_190 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImmediateCtx",(char (*) [14])Args_1);
    Args_1 = (char *)0x90;
    DebugAssertionFailed
              ((Char *)local_190._8_8_,"GetDefaultSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._8_8_ != &local_178) {
      operator_delete((void *)local_190._8_8_,local_178._M_allocated_capacity + 1);
    }
  }
  this_00 = (this->m_GLPrograms->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (this_00 == (GLProgram *)0x0) {
LAB_0017b76c:
    FormatString<char[26],char[99]>
              ((string *)(local_190 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded"
               ,(char (*) [99])Args_1);
    pcVar7 = "GetDefaultSignatureDesc";
    Args_1 = (char *)0x91;
    DebugAssertionFailed
              ((Char *)local_190._8_8_,"GetDefaultSignatureDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x91);
    pSVar6 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._8_8_ != &local_178) {
      pcVar7 = (char *)(local_178._M_allocated_capacity + 1);
      operator_delete((void *)local_190._8_8_,(ulong)pcVar7);
      pSVar6 = extraout_RDX_03;
    }
  }
  else {
    pcVar7 = (char *)0x0;
    LVar3 = GLProgram::GetLinkStatus(this_00,false);
    pSVar6 = extraout_RDX_01;
    if (LVar3 != Succeeded) goto LAB_0017b76c;
  }
  NumAllowedTypes = (Uint32)Args_1;
  if ((((this->m_GLPrograms->super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->m_pResources).
      super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    SamplerResourceFlag = GetSamplerResourceFlag(this,ShaderStages,true);
    State = (GLContextState *)(local_190._0_8_ + 0x750);
    pcVar7 = (char *)(ulong)ActiveStages;
    GLProgram::LoadResources
              ((this->m_GLPrograms->
               super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               ActiveStages,SamplerResourceFlag,State,false,SHADER_SOURCE_LANGUAGE_DEFAULT);
    NumAllowedTypes = (Uint32)State;
    pSVar6 = extraout_RDX_04;
  }
  p_Stack_160 = &local_68;
  HandleUB_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)p_Stack_160;
  HandleUB_00.ResourceLayout = ResourceLayout;
  HandleUB_00.SignDesc = __return_storage_ptr__;
  HandleUB_00.this = this;
  HandleTexture_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)p_Stack_160;
  HandleTexture_00.ResourceLayout = ResourceLayout;
  HandleTexture_00.SignDesc = __return_storage_ptr__;
  HandleTexture_00.this = this;
  HandleImg_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)p_Stack_160;
  HandleImg_00.ResourceLayout = ResourceLayout;
  HandleImg_00.SignDesc = __return_storage_ptr__;
  HandleImg_00.this = this;
  HandleSB_00.UniqueResources =
       (unordered_map<Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&,_Diligent::ShaderResourceHashKey::Hasher,_std::equal_to<Diligent::ShaderResourceHashKey>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>_>
        *)p_Stack_160;
  HandleSB_00.ResourceLayout = ResourceLayout;
  HandleSB_00.SignDesc = __return_storage_ptr__;
  HandleSB_00.this = this;
  local_168 = ResourceLayout;
  local_158 = __return_storage_ptr__;
  pPStack_150 = this;
  local_148 = ResourceLayout;
  p_Stack_140 = p_Stack_160;
  local_138 = __return_storage_ptr__;
  pPStack_130 = this;
  local_128 = ResourceLayout;
  p_Stack_120 = p_Stack_160;
  local_118 = __return_storage_ptr__;
  pPStack_110 = this;
  local_108 = ResourceLayout;
  p_Stack_100 = p_Stack_160;
  local_f8 = __return_storage_ptr__;
  pPStack_f0 = this;
  ShaderResourcesGL::
  ProcessConstResources<Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0,Diligent::PipelineStateGLImpl::GetDefaultSignatureDesc(std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>const&,Diligent::SHADER_TYPE)::__0>
            ((((this->m_GLPrograms->
               super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_pResources).
             super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,HandleUB_00,HandleTexture_00,HandleImg_00,HandleSB_00,
             (PipelineResourceLayoutDesc *)pcVar7,pSVar6,NumAllowedTypes);
  if ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
      .m_Desc.ResourceLayout.NumImmutableSamplers != 0) {
    pIVar2 = (__return_storage_ptr__->m_ImmutableSamplers).
             super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar5 = (__return_storage_ptr__->m_ImmutableSamplers).
                  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                  ._M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar2; pIVar5 = pIVar5 + 1)
    {
      pIVar5->ShaderStages = ActiveStages;
    }
  }
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_190);
LAB_0017b93b:
  std::
  _Hashtable<Diligent::ShaderResourceHashKey,_std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>,_std::allocator<std::pair<const_Diligent::ShaderResourceHashKey,_const_Diligent::ShaderResourcesGL::GLResourceAttribs_&>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::ShaderResourceHashKey>,_Diligent::ShaderResourceHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureDescWrapper PipelineStateGLImpl::GetDefaultSignatureDesc(
    const TShaderStages& ShaderStages,
    SHADER_TYPE          ActiveStages)
{
    const auto& ResourceLayout = m_Desc.ResourceLayout;

    PipelineResourceSignatureDescWrapper SignDesc{m_Desc.Name, ResourceLayout, m_Desc.SRBAllocationGranularity};
    SignDesc.SetCombinedSamplerSuffix(PipelineResourceSignatureDesc{}.CombinedSamplerSuffix);

    std::unordered_map<ShaderResourceHashKey, const ShaderResourcesGL::GLResourceAttribs&, ShaderResourceHashKey::Hasher> UniqueResources;

    const auto HandleResource = [&](const ShaderResourcesGL::GLResourceAttribs& Attribs) //
    {
        const auto VarDesc     = FindPipelineResourceLayoutVariable(ResourceLayout, Attribs.Name, Attribs.ShaderStages, nullptr);
        const auto it_assigned = UniqueResources.emplace(ShaderResourceHashKey{VarDesc.ShaderStages, Attribs.Name}, Attribs);
        if (it_assigned.second)
        {
            const auto Flags = Attribs.ResourceFlags | ShaderVariableFlagsToPipelineResourceFlags(VarDesc.Flags);
            SignDesc.AddResource(VarDesc.ShaderStages, Attribs.Name, Attribs.ArraySize, Attribs.ResourceType, VarDesc.Type, Flags);
        }
        else
        {
            VerifyResourceMerge(m_Desc, it_assigned.first->second, Attribs);
        }
    };

    if (m_IsProgramPipelineSupported)
    {
        for (size_t i = 0; i < ShaderStages.size(); ++i)
        {
            ShaderGLImpl* pShaderGL = ShaderStages[i];
            pShaderGL->GetShaderResources()->ProcessConstResources(HandleResource, HandleResource, HandleResource, HandleResource);
        }
    }
    else
    {
        auto pImmediateCtx = m_pDevice->GetImmediateContext(0);
        VERIFY_EXPR(pImmediateCtx);
        VERIFY_EXPR(m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded);

        if (!m_GLPrograms[0]->GetResources())
        {
            // Load resources first time this program is used
            const auto SamplerResFlag = GetSamplerResourceFlag(ShaderStages, true /*SilenceWarning*/);
            m_GLPrograms[0]->LoadResources(
                ActiveStages,
                SamplerResFlag,
                pImmediateCtx->GetContextState());
        }
        m_GLPrograms[0]->GetResources()->ProcessConstResources(HandleResource, HandleResource, HandleResource, HandleResource);

        if (ResourceLayout.NumImmutableSamplers > 0)
        {
            // Apply each immutable sampler to all shader stages
            SignDesc.ProcessImmutableSamplers(
                [ActiveStages](ImmutableSamplerDesc& SamDesc) //
                {
                    SamDesc.ShaderStages = ActiveStages;
                });
        }
    }

    return SignDesc;
}